

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

Vec_Ptr_t * Llb_Nonlin4Group(DdManager *dd,Vec_Ptr_t *vParts,Vec_Int_t *vVars2Q,int nSizeMax)

{
  int iVar1;
  int iVar2;
  Llb_Mgr_t_conflict *p_00;
  int local_5c;
  int nReorders;
  int i;
  Llb_Mgr_t_conflict *p;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *pPart;
  Vec_Ptr_t *vGroups;
  Vec_Int_t *pVStack_28;
  int nSizeMax_local;
  Vec_Int_t *vVars2Q_local;
  Vec_Ptr_t *vParts_local;
  DdManager *dd_local;
  
  vGroups._4_4_ = nSizeMax;
  pVStack_28 = vVars2Q;
  vVars2Q_local = (Vec_Int_t *)vParts;
  vParts_local = (Vec_Ptr_t *)dd;
  p_00 = Llb_Nonlin4Alloc(dd,vParts,(DdNode *)0x0,vVars2Q,nSizeMax);
  for (local_5c = 0; local_5c < p_00->iPartFree; local_5c = local_5c + 1) {
    pPart1 = Llb_MgrPart(p_00,local_5c);
    if ((pPart1 != (Llb_Prt_t *)0x0) &&
       (iVar1 = Llb_Nonlin4HasSingletonVars(p_00,pPart1), iVar1 != 0)) {
      Llb_Nonlin4Quantify1(p_00,pPart1);
    }
  }
  Llb_Nonlin4RecomputeScores(p_00);
  while( true ) {
    iVar1 = Llb_Nonlin4NextPartitions(p_00,&pPart2,(Llb_Prt_t **)&p);
    if (iVar1 == 0) {
      pPart = (Llb_Prt_t *)Vec_PtrAlloc(1000);
      local_5c = 0;
      do {
        if (p_00->iPartFree <= local_5c) {
          Llb_Nonlin4Free(p_00);
          return (Vec_Ptr_t *)pPart;
        }
        pPart1 = Llb_MgrPart(p_00,local_5c);
        if (pPart1 != (Llb_Prt_t *)0x0) {
          if (*(int *)((ulong)pPart1->bFunc & 0xfffffffffffffffe) == 0x7fffffff) {
            if (((ulong)pPart1->bFunc & 1) != 0) {
              __assert_fail("!Cudd_IsComplement(pPart->bFunc)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Image.c"
                            ,0x34a,
                            "Vec_Ptr_t *Llb_Nonlin4Group(DdManager *, Vec_Ptr_t *, Vec_Int_t *, int)"
                           );
            }
          }
          else {
            Vec_PtrPush((Vec_Ptr_t *)pPart,pPart1->bFunc);
            Cudd_Ref(pPart1->bFunc);
          }
        }
        local_5c = local_5c + 1;
      } while( true );
    }
    iVar1 = Cudd_ReadReorderings((DdManager *)vParts_local);
    iVar2 = Llb_Nonlin4Quantify2(p_00,pPart2,(Llb_Prt_t *)p);
    if (iVar2 == 0) break;
    iVar2 = Cudd_ReadReorderings((DdManager *)vParts_local);
    if (iVar1 < iVar2) {
      Llb_Nonlin4RecomputeScores(p_00);
    }
  }
  Llb_Nonlin4Free(p_00);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Group( DdManager * dd, Vec_Ptr_t * vParts, Vec_Int_t * vVars2Q, int nSizeMax )
{
    Vec_Ptr_t * vGroups;
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    int i, nReorders;//, clk = Abc_Clock();
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, NULL, vVars2Q, nSizeMax );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    vGroups = Vec_PtrAlloc( 1000 );
    Llb_MgrForEachPart( p, pPart, i )
    {
//printf( "Iteration %d ", pPart->iPart );
        if ( Cudd_IsConstant(pPart->bFunc) )
        {
//printf( "Constant\n" );
            assert( !Cudd_IsComplement(pPart->bFunc) );
            continue;
        }
//printf( "\n" );
        Vec_PtrPush( vGroups, pPart->bFunc );
        Cudd_Ref( pPart->bFunc );
//printf( "Part %d  ", pPart->iPart );
//Extra_bddPrintSupport( p->dd, pPart->bFunc ); printf( "\n" );
    }
    Llb_Nonlin4Free( p );
//Abc_PrintTime( 1, "Reparametrization time", Abc_Clock() - clk );
    return vGroups;
}